

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

int __thiscall icu_63::UnicodeString::truncate(UnicodeString *this,char *__file,__off_t __length)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = (uint)__file;
  if (uVar3 == 0 && (uVar1 & 1) != 0) {
    unBogus(this);
    return 0;
  }
  if ((short)uVar1 < 0) {
    uVar2 = (this->fUnion).fFields.fLength;
  }
  else {
    uVar2 = (int)(short)uVar1 >> 5;
  }
  if (uVar3 < uVar2) {
    if ((int)uVar3 < 0x400) {
      uVar2 = uVar1 & 0x1f;
      (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(uVar3 << 5) | (ushort)uVar2;
    }
    else {
      uVar2 = uVar1 | 0xffe0;
      (this->fUnion).fStackFields.fLengthAndFlags = (int16_t)uVar2;
      (this->fUnion).fFields.fLength = uVar3;
    }
    return (int)CONCAT71((uint7)(uint3)(uVar2 >> 8),1);
  }
  return 0;
}

Assistant:

inline UBool
UnicodeString::isBogus() const
{ return (UBool)(fUnion.fFields.fLengthAndFlags & kIsBogus); }